

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O0

ssize_t __thiscall Atari::ST::Video::write(Video *this,int __fd,void *__buf,size_t __n)

{
  Video *pVVar1;
  ulong uVar2;
  Video *extraout_RAX;
  Video *extraout_RAX_00;
  uint8_t *entry;
  anon_class_16_2_f8a5d25e local_50;
  function<void_()> local_40;
  HalfCycles local_20;
  ushort local_16;
  uint local_14;
  uint16_t value_local;
  Video *pVStack_10;
  int address_local;
  Video *this_local;
  
  local_16 = (ushort)__buf;
  local_14 = __fd & 0x3f;
  uVar2 = (ulong)local_14;
  pVVar1 = (Video *)(uVar2 - 0x30);
  if (uVar2 < 0x30 || (Video *)(uVar2 - 0x30) == (Video *)0x0) {
    pVVar1 = (Video *)((long)&switchD_006e8f89::switchdataD_00a4ddd4 +
                      (long)(int)(&switchD_006e8f89::switchdataD_00a4ddd4)[uVar2]);
    pVStack_10 = this;
    switch(local_14) {
    case 0:
      this->base_address_ = this->base_address_ & 0xffffU | (local_16 & 0xff) << 0x10;
      break;
    case 1:
      this->base_address_ = this->base_address_ & 0xff00ffU | (local_16 & 0xff) << 8;
      break;
    default:
      goto switchD_006e8f89_caseD_2;
    case 5:
      HalfCycles::HalfCycles(&local_20,2);
      local_50.value = local_16;
      local_50.this = this;
      std::function<void()>::function<Atari::ST::Video::write(int,unsigned_short)::__0,void>
                ((function<void()> *)&local_40,&local_50);
      DeferredQueue<HalfCycles>::defer(&this->deferrer_,local_20,&local_40);
      std::function<void_()>::~function(&local_40);
      this = extraout_RAX;
      break;
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
      if (local_14 == 0x20) {
        VideoStream::will_change_border_colour(&this->video_stream_);
      }
      this->raw_palette_[(int)(local_14 - 0x20)] = local_16;
      this = (Video *)(this->palette_ + (int)(local_14 - 0x20));
      *(char *)&(this->deferrer_).pending_actions_.
                super__Vector_base<DeferredQueue<HalfCycles>::DeferredAction,_std::allocator<DeferredQueue<HalfCycles>::DeferredAction>_>
                ._M_impl.super__Vector_impl_data._M_start = (char)((int)(local_16 & 0x700) >> 7);
      *(char *)((long)&(this->deferrer_).pending_actions_.
                       super__Vector_base<DeferredQueue<HalfCycles>::DeferredAction,_std::allocator<DeferredQueue<HalfCycles>::DeferredAction>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1) =
           (char)((local_16 & 0x77) << 1);
      break;
    case 0x30:
      this->video_mode_ = local_16;
      update_output_mode(this);
      this = extraout_RAX_00;
    }
  }
  else {
switchD_006e8f89_caseD_2:
    this = pVVar1;
  }
  return (ssize_t)this;
}

Assistant:

void Video::write(int address, uint16_t value) {
	address &= 0x3f;
	switch(address) {
		default: break;

		// Start address.
		case 0x00:	base_address_ = (base_address_ & 0x00ffff) | ((value & 0xff) << 16);	break;
		case 0x01:	base_address_ = (base_address_ & 0xff00ff) | ((value & 0xff) << 8);		break;

		// Sync mode and pixel mode.
		case 0x05:
			// Writes to sync mode have a one-cycle delay in effect.
			deferrer_.defer(HalfCycles(2), [this, value] {
				sync_mode_ = value;
				update_output_mode();
			});
		break;
		case 0x30:
			video_mode_ = value;
			update_output_mode();
		break;

		// Palette.
		case 0x20:	case 0x21:	case 0x22:	case 0x23:
		case 0x24:	case 0x25:	case 0x26:	case 0x27:
		case 0x28:	case 0x29:	case 0x2a:	case 0x2b:
		case 0x2c:	case 0x2d:	case 0x2e:	case 0x2f: {
			if(address == 0x20) video_stream_.will_change_border_colour();

			raw_palette_[address - 0x20] = value;
			uint8_t *const entry = reinterpret_cast<uint8_t *>(&palette_[address - 0x20]);
			entry[0] = uint8_t((value & 0x700) >> 7);
			entry[1] = uint8_t((value & 0x77) << 1);
		} break;
	}
}